

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::checkKeyHasValidType(Builder *this,Slice item)

{
  bool bVar1;
  reference pvVar2;
  Exception *this_00;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_RDI;
  ValueLength pos;
  ExceptionType in_stack_ffffffffffffffcc;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *in_stack_ffffffffffffffd0;
  byte local_21;
  
  bVar1 = std::
          vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
          ::empty(in_RDI);
  if (!bVar1) {
    pvVar2 = std::
             vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
             ::back(in_stack_ffffffffffffffd0);
    if ((*(char *)((long)&((in_RDI->
                           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                           )._M_impl.super__Vector_impl_data._M_end_of_storage)->startPos +
                  pvVar2->startPos) == '\v') ||
       (*(char *)((long)&((in_RDI->
                          super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage)->startPos +
                 pvVar2->startPos) == '\x14')) {
      local_21 = 0;
      if (((ulong)in_RDI[5].
                  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                  ._M_impl.super__Vector_impl_data._M_start & 1) == 0) {
        bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isString
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           0x112412);
        local_21 = 0;
        if (!bVar1) {
          bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isSmallInt
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             0x112429);
          local_21 = 0;
          if (!bVar1) {
            bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isUInt
                              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                *)0x112440);
            local_21 = bVar1 ^ 0xff;
          }
        }
      }
      if ((local_21 & 1) != 0) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception(this_00,in_stack_ffffffffffffffcc);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
      *(byte *)&in_RDI[5].
                super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                ._M_impl.super__Vector_impl_data._M_start =
           (*(byte *)&in_RDI[5].
                      super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                      ._M_impl.super__Vector_impl_data._M_start ^ 0xff) & 1;
    }
  }
  return;
}

Assistant:

inline void checkKeyHasValidType(Slice item) {
    if (!_stack.empty()) {
      ValueLength pos = _stack.back().startPos;
      if (_start[pos] == 0x0b || _start[pos] == 0x14) {
        if (VELOCYPACK_UNLIKELY(!_keyWritten && !item.isString() &&
                                !item.isSmallInt() && !item.isUInt())) {
          throw Exception(Exception::BuilderKeyMustBeString);
        }
        _keyWritten = !_keyWritten;
      }
    }
  }